

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_matrix.cpp
# Opt level: O0

void __thiscall VSMatrix::computeNormalMatrix(VSMatrix *this,FLOATTYPE *aMatrix)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  FLOATTYPE invDet;
  FLOATTYPE det;
  FLOATTYPE mMat3x3 [9];
  FLOATTYPE *aMatrix_local;
  VSMatrix *this_local;
  
  fVar1 = *aMatrix;
  fVar2 = aMatrix[1];
  fVar3 = aMatrix[2];
  fVar4 = aMatrix[4];
  fVar5 = aMatrix[5];
  fVar6 = aMatrix[6];
  fVar7 = aMatrix[8];
  fVar8 = aMatrix[9];
  fVar9 = aMatrix[10];
  fVar10 = 1.0 / (fVar1 * (fVar5 * fVar9 - fVar6 * fVar8) + fVar2 * (fVar6 * fVar7 - fVar9 * fVar4)
                 + fVar3 * (fVar4 * fVar8 - fVar5 * fVar7));
  this->mMatrix[0] = (fVar5 * fVar9 - fVar6 * fVar8) * fVar10;
  this->mMatrix[1] = (fVar6 * fVar7 - fVar9 * fVar4) * fVar10;
  this->mMatrix[2] = (fVar4 * fVar8 - fVar5 * fVar7) * fVar10;
  this->mMatrix[3] = 0.0;
  this->mMatrix[4] = (fVar3 * fVar8 - fVar2 * fVar9) * fVar10;
  this->mMatrix[5] = (fVar1 * fVar9 - fVar3 * fVar7) * fVar10;
  this->mMatrix[6] = (fVar2 * fVar7 - fVar8 * fVar1) * fVar10;
  this->mMatrix[7] = 0.0;
  this->mMatrix[8] = (fVar2 * fVar6 - fVar5 * fVar3) * fVar10;
  this->mMatrix[9] = (fVar3 * fVar4 - fVar1 * fVar6) * fVar10;
  this->mMatrix[10] = (fVar1 * fVar5 - fVar4 * fVar2) * fVar10;
  this->mMatrix[0xb] = 0.0;
  this->mMatrix[0xc] = 0.0;
  this->mMatrix[0xd] = 0.0;
  this->mMatrix[0xe] = 0.0;
  this->mMatrix[0xf] = 1.0;
  return;
}

Assistant:

void
VSMatrix::computeNormalMatrix(const FLOATTYPE *aMatrix) 
{

	FLOATTYPE mMat3x3[9];

	mMat3x3[0] = aMatrix[0];
	mMat3x3[1] = aMatrix[1];
	mMat3x3[2] = aMatrix[2];

	mMat3x3[3] = aMatrix[4];
	mMat3x3[4] = aMatrix[5];
	mMat3x3[5] = aMatrix[6];

	mMat3x3[6] = aMatrix[8];
	mMat3x3[7] = aMatrix[9];
	mMat3x3[8] = aMatrix[10];

	FLOATTYPE det, invDet;

	det = mMat3x3[0] * (mMat3x3[4] * mMat3x3[8] - mMat3x3[5] * mMat3x3[7]) +
		  mMat3x3[1] * (mMat3x3[5] * mMat3x3[6] - mMat3x3[8] * mMat3x3[3]) +
		  mMat3x3[2] * (mMat3x3[3] * mMat3x3[7] - mMat3x3[4] * mMat3x3[6]);

	invDet = 1.0f/det;

	mMatrix[0] = (mMat3x3[4] * mMat3x3[8] - mMat3x3[5] * mMat3x3[7]) * invDet;
	mMatrix[1] = (mMat3x3[5] * mMat3x3[6] - mMat3x3[8] * mMat3x3[3]) * invDet;
	mMatrix[2] = (mMat3x3[3] * mMat3x3[7] - mMat3x3[4] * mMat3x3[6]) * invDet;
	mMatrix[3] = 0.0f;
	mMatrix[4] = (mMat3x3[2] * mMat3x3[7] - mMat3x3[1] * mMat3x3[8]) * invDet;
	mMatrix[5] = (mMat3x3[0] * mMat3x3[8] - mMat3x3[2] * mMat3x3[6]) * invDet;
	mMatrix[6] = (mMat3x3[1] * mMat3x3[6] - mMat3x3[7] * mMat3x3[0]) * invDet;
	mMatrix[7] = 0.0f;
	mMatrix[8] = (mMat3x3[1] * mMat3x3[5] - mMat3x3[4] * mMat3x3[2]) * invDet;
	mMatrix[9] = (mMat3x3[2] * mMat3x3[3] - mMat3x3[0] * mMat3x3[5]) * invDet;
	mMatrix[10] =(mMat3x3[0] * mMat3x3[4] - mMat3x3[3] * mMat3x3[1]) * invDet;
	mMatrix[11] = 0.0;
	mMatrix[12] = 0.0;
	mMatrix[13] = 0.0;
	mMatrix[14] = 0.0;
	mMatrix[15] = 1.0;

}